

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O2

void GC::ResetGC(void)

{
  if (rootsA != 0) {
    (*(code *)NULLC::dealloc)();
  }
  rootsA = 0;
  uRam00000000002273c0 = 0;
  if (rootsB != 0) {
    (*(code *)NULLC::dealloc)();
  }
  rootsB = 0;
  uRam00000000002273d0 = 0;
  HashMap<int>::reset((HashMap<int> *)&functionIDs);
  return;
}

Assistant:

void GC::ResetGC()
{
	GC::rootsA.reset();
	GC::rootsB.reset();

	GC::functionIDs.reset();
}